

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O1

void addrinfo_sort_list(addrinfo **ailist,_func_int_addrinfo_ptr_addrinfo_ptr *compare)

{
  addrinfo *paVar1;
  int iVar2;
  addrinfo *paVar3;
  addrinfo *paVar4;
  addrinfo *temp;
  addrinfo *paVar5;
  addrinfo *paVar6;
  addrinfo *paVar7;
  
  if (*ailist == (addrinfo *)0x0) {
    paVar7 = (addrinfo *)0x0;
  }
  else {
    paVar4 = *ailist;
    paVar6 = (addrinfo *)0x0;
    do {
      paVar1 = paVar4->ai_next;
      paVar7 = paVar4;
      if (paVar6 == (addrinfo *)0x0) {
        paVar5 = (addrinfo *)0x0;
      }
      else {
        iVar2 = (*compare)(paVar4,paVar6);
        paVar5 = paVar6;
        if (iVar2 < 0) {
          paVar3 = (addrinfo *)0x0;
        }
        else {
          do {
            paVar3 = paVar5;
            paVar5 = paVar3->ai_next;
            if (paVar5 == (addrinfo *)0x0) break;
            iVar2 = (*compare)(paVar4,paVar5);
          } while (-1 < iVar2);
        }
        if (paVar3 != (addrinfo *)0x0) {
          paVar3->ai_next = paVar4;
          paVar7 = paVar6;
        }
      }
      paVar4->ai_next = paVar5;
      paVar4 = paVar1;
      paVar6 = paVar7;
    } while (paVar1 != (addrinfo *)0x0);
  }
  *ailist = paVar7;
  return;
}

Assistant:

void addrinfo_sort_list(struct addrinfo **ailist,
    int (*compare)(const struct addrinfo*, const struct addrinfo*))
{
    struct addrinfo *result = NULL, *ai = (*ailist);
    while (ai)
    {
        struct addrinfo *temp = ai;
        ai = ai->ai_next;
        if (result)
        {
            struct addrinfo *ai2 = result, *last = NULL;
            while (ai2 && (compare(temp, ai2) >= 0))
            {
                last = ai2;
                ai2 = ai2->ai_next;
            }
            if (last)
            {
                last->ai_next = temp;
                temp->ai_next = ai2;
            }
            else
            {
                result = temp;
                temp->ai_next = ai2;
            }
        }
        else
        {
            result = temp;
            temp->ai_next = NULL;
        }
    }
    *ailist = result;
}